

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O1

void log_packet(LogContext *ctx,int direction,int type,char *texttype,void *data,size_t len,
               int n_blanks,logblank_t *blanks,unsigned_long *seq,uint downstream_id,
               char *additional_log_text)

{
  int *piVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ptrlen data_00;
  char dumpdata [128];
  tm local_170;
  char local_138 [12];
  undefined2 auStack_12c [24];
  undefined2 local_fb;
  undefined1 auStack_f9 [201];
  
  if ((ctx->logtype == 4) || (texttype != (char *)0x0 && ctx->logtype == 3)) {
    if (texttype == (char *)0x0) {
      ltime();
      strftime(local_138,0x18,"%Y-%m-%d %H:%M:%S",&local_170);
      pcVar3 = "Outgoing";
      if (direction == 0) {
        pcVar3 = "Incoming";
      }
      logprintf(ctx,"%s raw data at %s\r\n",pcVar3,local_138);
    }
    else {
      pcVar3 = "Outgoing";
      if (direction == 0) {
        pcVar3 = "Incoming";
      }
      logprintf(ctx,"%s packet ",pcVar3);
      if (seq != (unsigned_long *)0x0) {
        logprintf(ctx,"#0x%lx, ",*seq);
      }
      logprintf(ctx,"type %d / 0x%02x (%s)",(ulong)(uint)type,(ulong)(uint)type,texttype);
      if ((downstream_id != 0) &&
         (logprintf(ctx," on behalf of downstream #%u",(ulong)downstream_id),
         additional_log_text != (char *)0x0)) {
        logprintf(ctx," (%s)",additional_log_text);
      }
      logprintf(ctx,"\r\n");
    }
    if (len == 0) {
      lVar7 = 0;
    }
    else {
      uVar12 = (ulong)n_blanks;
      uVar4 = 0;
      iVar11 = 0;
      lVar7 = 0;
      uVar8 = 0;
      do {
        iVar5 = 0;
        uVar9 = uVar8;
        if (uVar8 < uVar12) {
          piVar1 = &blanks[uVar8].type;
          do {
            if (uVar4 < (ulong)((long)piVar1[-1] + (long)((logblank_t *)(piVar1 + -2))->offset)) {
              uVar9 = uVar8;
              iVar5 = 0;
              if ((ulong)(long)((logblank_t *)(piVar1 + -2))->offset <= uVar4) {
                iVar5 = *piVar1;
              }
              break;
            }
            uVar8 = uVar8 + 1;
            piVar1 = piVar1 + 3;
            uVar9 = uVar12;
          } while (uVar12 != uVar8);
        }
        if (lVar7 != 0 && iVar5 != 2) {
          pcVar3 = "s";
          if (lVar7 == 1) {
            pcVar3 = "";
          }
          logprintf(ctx,"  (%zu byte%s omitted)\r\n",lVar7,pcVar3);
          lVar7 = 0;
        }
        if (lVar7 == 0 && iVar11 == 0) {
          sprintf(local_138,"  %08zx%*s\r\n",uVar4 & 0xfffffffffffffff0,0x43,"");
        }
        if (iVar5 == 1) {
          local_170.tm_sec._2_1_ = 0;
          local_170.tm_sec._0_2_ = 0x5858;
          uVar6 = 0x58;
LAB_0011eb47:
          uVar10 = (uint)uVar4 & 0xf;
          *(undefined2 *)((long)auStack_12c + (ulong)uVar10 * 3) = (undefined2)local_170.tm_sec;
          if (0x5e < uVar6 - 0x20) {
            uVar6 = 0x2e;
          }
          *(char *)((long)&local_fb + (ulong)uVar10) = (char)uVar6;
          iVar11 = uVar10 + 1;
        }
        else {
          if (iVar5 != 2) {
            uVar6 = (uint)*(byte *)((long)data + uVar4);
            sprintf((char *)&local_170,"%02x",(ulong)*(byte *)((long)data + uVar4));
            goto LAB_0011eb47;
          }
          lVar7 = lVar7 + 1;
        }
        uVar4 = uVar4 + 1;
        if ((uVar4 & 0xf) == 0) {
          iVar5 = 0;
          if (iVar11 != 0) goto LAB_0011eba5;
        }
        else {
          iVar5 = iVar11;
          if ((lVar7 != 0 || uVar4 == len) && iVar11 != 0) {
LAB_0011eba5:
            auStack_f9[iVar11] = 0;
            *(undefined2 *)((long)&local_fb + (long)iVar11) = 0xa0d;
            sVar2 = strlen(local_138);
            data_00.len = sVar2;
            data_00.ptr = local_138;
            logwrite(ctx,data_00);
            iVar5 = 0;
          }
        }
        iVar11 = iVar5;
        uVar8 = uVar9;
      } while (uVar4 != len);
    }
    if (lVar7 != 0) {
      pcVar3 = "s";
      if (lVar7 == 1) {
        pcVar3 = "";
      }
      logprintf(ctx,"  (%zu byte%s omitted)\r\n",lVar7,pcVar3);
    }
    if ((0 < ctx->logtype) && (ctx->state == L_OPEN)) {
      fflush((FILE *)ctx->lgfp);
    }
  }
  return;
}

Assistant:

void log_packet(LogContext *ctx, int direction, int type,
                const char *texttype, const void *data, size_t len,
                int n_blanks, const struct logblank_t *blanks,
                const unsigned long *seq,
                unsigned downstream_id, const char *additional_log_text)
{
    char dumpdata[128], smalldata[5];
    size_t p = 0, b = 0, omitted = 0;
    int output_pos = 0; /* NZ if pending output in dumpdata */

    if (!(ctx->logtype == LGTYP_SSHRAW ||
          (ctx->logtype == LGTYP_PACKETS && texttype)))
        return;

    /* Packet header. */
    if (texttype) {
        logprintf(ctx, "%s packet ",
                  direction == PKT_INCOMING ? "Incoming" : "Outgoing");

        if (seq)
            logprintf(ctx, "#0x%lx, ", *seq);

        logprintf(ctx, "type %d / 0x%02x (%s)", type, type, texttype);

        if (downstream_id) {
            logprintf(ctx, " on behalf of downstream #%u", downstream_id);
            if (additional_log_text)
                logprintf(ctx, " (%s)", additional_log_text);
        }

        logprintf(ctx, "\r\n");
    } else {
        /*
         * Raw data is logged with a timestamp, so that it's possible
         * to determine whether a mysterious delay occurred at the
         * client or server end. (Timestamping the raw data avoids
         * cluttering the normal case of only logging decrypted SSH
         * messages, and also adds conceptual rigour in the case where
         * an SSH message arrives in several pieces.)
         */
        char buf[256];
        struct tm tm;
        tm = ltime();
        strftime(buf, 24, "%Y-%m-%d %H:%M:%S", &tm);
        logprintf(ctx, "%s raw data at %s\r\n",
                  direction == PKT_INCOMING ? "Incoming" : "Outgoing",
                  buf);
    }

    /*
     * Output a hex/ASCII dump of the packet body, blanking/omitting
     * parts as specified.
     */
    while (p < len) {
        int blktype;

        /* Move to a current entry in the blanking array. */
        while ((b < n_blanks) &&
               (p >= blanks[b].offset + blanks[b].len))
            b++;
        /* Work out what type of blanking to apply to
         * this byte. */
        blktype = PKTLOG_EMIT; /* default */
        if ((b < n_blanks) &&
            (p >= blanks[b].offset) &&
            (p < blanks[b].offset + blanks[b].len))
            blktype = blanks[b].type;

        /* If we're about to stop omitting, it's time to say how
         * much we omitted. */
        if ((blktype != PKTLOG_OMIT) && omitted) {
            logprintf(ctx, "  (%"SIZEu" byte%s omitted)\r\n",
                      omitted, (omitted==1?"":"s"));
            omitted = 0;
        }

        /* (Re-)initialise dumpdata as necessary
         * (start of row, or if we've just stopped omitting) */
        if (!output_pos && !omitted)
            sprintf(dumpdata, "  %08"SIZEx"%*s\r\n",
                    p-(p%16), 1+3*16+2+16, "");

        /* Deal with the current byte. */
        if (blktype == PKTLOG_OMIT) {
            omitted++;
        } else {
            int c;
            if (blktype == PKTLOG_BLANK) {
                c = 'X';
                sprintf(smalldata, "XX");
            } else {  /* PKTLOG_EMIT */
                c = ((const unsigned char *)data)[p];
                sprintf(smalldata, "%02x", c);
            }
            dumpdata[10+2+3*(p%16)] = smalldata[0];
            dumpdata[10+2+3*(p%16)+1] = smalldata[1];
            dumpdata[10+1+3*16+2+(p%16)] = (c >= 0x20 && c < 0x7F ? c : '.');
            output_pos = (p%16) + 1;
        }

        p++;

        /* Flush row if necessary */
        if (((p % 16) == 0) || (p == len) || omitted) {
            if (output_pos) {
                strcpy(dumpdata + 10+1+3*16+2+output_pos, "\r\n");
                logwrite(ctx, ptrlen_from_asciz(dumpdata));
                output_pos = 0;
            }
        }

    }

    /* Tidy up */
    if (omitted)
        logprintf(ctx, "  (%"SIZEu" byte%s omitted)\r\n",
                  omitted, (omitted==1?"":"s"));
    logflush(ctx);
}